

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNearestNeighborsClassifierValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)404>(Result *__return_storage_ptr__,Model *format)

{
  byte bVar1;
  bool bVar2;
  WeightingSchemeCase WVar3;
  DefaultClassLabelCase DVar4;
  Int64Parameter *int64Parameter;
  Int64Vector *this;
  StringVector *this_00;
  int *piVar5;
  ostream *poVar6;
  KNearestNeighborsClassifier *model;
  ValidationPolicy *in_stack_fffffffffffff7e8;
  Result *this_01;
  ClassLabelsCase local_7c8;
  int local_7b0;
  ValidationPolicy local_764;
  Result local_760;
  string local_738;
  stringstream local_718 [8];
  stringstream out_3;
  ostream local_708 [376];
  string local_590;
  stringstream local_570 [8];
  stringstream out_2;
  ostream local_560 [376];
  string local_3e8;
  stringstream local_3c8 [8];
  stringstream out_1;
  ostream local_3b8 [383];
  byte local_239;
  ClassLabelsCase local_238;
  int iStack_234;
  bool defaultClassLabelIsInt64;
  ClassLabelsCase classLabelCase;
  int labelCount;
  int stringLabelCount;
  int intLabelCount;
  stringstream local_208 [8];
  stringstream out;
  ostream local_1f8 [376];
  undefined4 local_80;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  Result res;
  KNearestNeighborsClassifier *knnClassifier;
  Model *format_local;
  
  res.m_message.field_2._8_8_ = Specification::Model::knearestneighborsclassifier(format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"numberOfNeighbors",&local_69);
  int64Parameter =
       Specification::KNearestNeighborsClassifier::numberofneighbors
                 ((KNearestNeighborsClassifier *)res.m_message.field_2._8_8_);
  validateInt64Parameter((Result *)local_48,&local_68,int64Parameter,true);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  bVar2 = Result::good((Result *)local_48);
  if (bVar2) {
    WVar3 = Specification::KNearestNeighborsClassifier::WeightingScheme_case
                      ((KNearestNeighborsClassifier *)res.m_message.field_2._8_8_);
    if (WVar3 == WEIGHTINGSCHEME_NOT_SET) {
      std::__cxx11::stringstream::stringstream(local_208);
      poVar6 = std::operator<<(local_1f8,
                               "KNearestNeighborsClassifier requires a weighting scheme to be set.")
      ;
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&stringLabelCount);
      std::__cxx11::string::~string((string *)&stringLabelCount);
      local_80 = 1;
      std::__cxx11::stringstream::~stringstream(local_208);
    }
    else {
      bVar2 = Specification::KNearestNeighborsClassifier::has_int64classlabels
                        ((KNearestNeighborsClassifier *)res.m_message.field_2._8_8_);
      if (bVar2) {
        this = Specification::KNearestNeighborsClassifier::int64classlabels
                         ((KNearestNeighborsClassifier *)res.m_message.field_2._8_8_);
        local_7b0 = Specification::Int64Vector::vector_size(this);
      }
      else {
        local_7b0 = 0;
      }
      labelCount = local_7b0;
      bVar2 = Specification::KNearestNeighborsClassifier::has_stringclasslabels
                        ((KNearestNeighborsClassifier *)res.m_message.field_2._8_8_);
      if (bVar2) {
        this_00 = Specification::KNearestNeighborsClassifier::stringclasslabels
                            ((KNearestNeighborsClassifier *)res.m_message.field_2._8_8_);
        local_7c8 = Specification::StringVector::vector_size(this_00);
      }
      else {
        local_7c8 = CLASSLABELS_NOT_SET;
      }
      classLabelCase = local_7c8;
      piVar5 = std::max<int>(&labelCount,(int *)&classLabelCase);
      iStack_234 = *piVar5;
      local_238 = Specification::KNearestNeighborsClassifier::ClassLabels_case
                            ((KNearestNeighborsClassifier *)res.m_message.field_2._8_8_);
      local_239 = 0;
      DVar4 = Specification::KNearestNeighborsClassifier::DefaultClassLabel_case
                        ((KNearestNeighborsClassifier *)res.m_message.field_2._8_8_);
      if (DVar4 == DEFAULTCLASSLABEL_NOT_SET) {
        if (iStack_234 == 0) {
          std::__cxx11::stringstream::stringstream(local_718);
          poVar6 = std::operator<<(local_708,
                                   "KNearestNeighborsClassifier should specify default class labels when class labels are not specified."
                                  );
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::stringstream::str();
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_738);
          std::__cxx11::string::~string((string *)&local_738);
          local_80 = 1;
          std::__cxx11::stringstream::~stringstream(local_718);
          goto LAB_004353c1;
        }
      }
      else if (DVar4 == kDefaultStringLabel) {
        if ((local_238 != CLASSLABELS_NOT_SET) && (local_238 != kStringClassLabels)) {
          std::__cxx11::stringstream::stringstream(local_3c8);
          poVar6 = std::operator<<(local_3b8,
                                   "KNearestNeighborsClassifier\'s class label and default class label have different types."
                                  );
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::stringstream::str();
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_3e8);
          std::__cxx11::string::~string((string *)&local_3e8);
          local_80 = 1;
          std::__cxx11::stringstream::~stringstream(local_3c8);
          goto LAB_004353c1;
        }
        local_239 = 0;
      }
      else if (DVar4 == kDefaultInt64Label) {
        if ((local_238 != CLASSLABELS_NOT_SET) && (local_238 != kInt64ClassLabels)) {
          std::__cxx11::stringstream::stringstream(local_570);
          poVar6 = std::operator<<(local_560,
                                   "KNearestNeighborsClassifier\'s class label and default class label have different types."
                                  );
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::stringstream::str();
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_590);
          std::__cxx11::string::~string((string *)&local_590);
          local_80 = 1;
          std::__cxx11::stringstream::~stringstream(local_570);
          goto LAB_004353c1;
        }
        local_239 = 1;
      }
      model = Specification::Model::knearestneighborsclassifier(format);
      bVar1 = local_239;
      ValidationPolicy::ValidationPolicy(&local_764);
      validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::KNearestNeighborsClassifier>
                (&local_760,(CoreML *)format,(Model *)model,(KNearestNeighborsClassifier *)0x1,
                 (bool)(bVar1 & 1),SUB81(&local_764,0),in_stack_fffffffffffff7e8);
      this_01 = &local_760;
      Result::operator=((Result *)local_48,this_01);
      Result::~Result(this_01);
      bVar2 = Result::good((Result *)local_48);
      if (bVar2) {
        validateNearestNeighborsIndex(__return_storage_ptr__,format,iStack_234);
        local_80 = 1;
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
        local_80 = 1;
      }
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_80 = 1;
  }
LAB_004353c1:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_kNearestNeighborsClassifier>(const Specification::Model& format) {

        const Specification::KNearestNeighborsClassifier& knnClassifier = format.knearestneighborsclassifier();

        Result res = validateInt64Parameter("numberOfNeighbors", knnClassifier.numberofneighbors(), true);
        if (!res.good()) {
            return res;
        }

        switch (knnClassifier.WeightingScheme_case()) {
            case Specification::KNearestNeighborsClassifier::kUniformWeighting:
            case Specification::KNearestNeighborsClassifier::kInverseDistanceWeighting:
                // Valid weighting scheme
                break;

            case Specification::KNearestNeighborsClassifier::WEIGHTINGSCHEME_NOT_SET:
                std::stringstream out;
                out << "KNearestNeighborsClassifier requires a weighting scheme to be set." << std::endl;
                return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
        }

        int intLabelCount = knnClassifier.has_int64classlabels() ? knnClassifier.int64classlabels().vector_size() : 0;
        int stringLabelCount = knnClassifier.has_stringclasslabels() ? knnClassifier.stringclasslabels().vector_size() : 0;

        int labelCount = std::max(intLabelCount, stringLabelCount);

        auto classLabelCase = knnClassifier.ClassLabels_case();
        auto defaultClassLabelIsInt64 = false;

        switch (knnClassifier.DefaultClassLabel_case()) {
            case Specification::KNearestNeighborsClassifier::kDefaultStringLabel:
                if (classLabelCase != Specification::KNearestNeighborsClassifier::CLASSLABELS_NOT_SET &&
                    classLabelCase != Specification::KNearestNeighborsClassifier::kStringClassLabels) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier's class label and default class label have different types." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
                defaultClassLabelIsInt64 = false;
                break;

            case Specification::KNearestNeighborsClassifier::kDefaultInt64Label:
                if (classLabelCase != Specification::KNearestNeighborsClassifier::CLASSLABELS_NOT_SET &&
                    classLabelCase != Specification::KNearestNeighborsClassifier::kInt64ClassLabels) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier's class label and default class label have different types." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
                defaultClassLabelIsInt64 = true;
                break;

            case Specification::KNearestNeighborsClassifier::DEFAULTCLASSLABEL_NOT_SET:
                if (labelCount == 0) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier should specify default class labels when class labels are not specified." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
        }

        res = validateClassifierInterface(format, format.knearestneighborsclassifier(), true, defaultClassLabelIsInt64);
        if (!res.good()) {
            return res;
        }


        return validateNearestNeighborsIndex(format, labelCount);

    }